

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

bool __thiscall QSQLiteDriver::subscribeToNotification(QSQLiteDriver *this,QString *name)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  cVar2 = (**(code **)(*(long *)this + 0x60))();
  if (cVar2 == '\0') {
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = lcSqlite::category.name;
      bVar3 = false;
      QMessageLogger::warning(local_48,"QSQLiteDriver::subscribeToNotification: Database not open.")
      ;
      goto LAB_001151d5;
    }
  }
  else {
    bVar3 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)(lVar1 + 200),name,CaseSensitive);
    if (!bVar3) {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)(lVar1 + 200),name);
      bVar3 = true;
      if (*(long *)(lVar1 + 0xd8) == 1) {
        sqlite3_update_hook(*(sqlite3 **)(lVar1 + 0xa8),handle_sqlite_callback,this);
      }
      goto LAB_001151d5;
    }
    lcSqlite();
    if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = lcSqlite::category.name;
      uVar4 = QString::utf16();
      bVar3 = false;
      QMessageLogger::warning
                (local_48,"QSQLiteDriver::subscribeToNotification: Already subscribing to \'%ls\'.",
                 uVar4);
      goto LAB_001151d5;
    }
  }
  bVar3 = false;
LAB_001151d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteDriver::subscribeToNotification(const QString &name)
{
    Q_D(QSQLiteDriver);
    if (!isOpen()) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Database not open.");
        return false;
    }

    if (d->notificationid.contains(name)) {
        qCWarning(lcSqlite, "QSQLiteDriver::subscribeToNotification: Already subscribing to '%ls'.",
                  qUtf16Printable(name));
        return false;
    }

    //sqlite supports only one notification callback, so only the first is registered
    d->notificationid << name;
    if (d->notificationid.size() == 1)
        sqlite3_update_hook(d->access, &handle_sqlite_callback, reinterpret_cast<void *> (this));

    return true;
}